

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O3

void CS248::Viewer::drawError(void)

{
  ulong uVar1;
  byte bVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  OSDText *pOVar7;
  int line_id;
  int line_id_00;
  int line_id_01;
  long lVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  Color color;
  Color color_00;
  Color color_01;
  string clickPrompt;
  string errorTitle;
  undefined1 *local_d0;
  char *local_c8;
  undefined1 local_c0 [16];
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  string local_90;
  string local_70;
  string local_50;
  
  if (showingError == '\x01') {
    puts("Showing Error! *******************");
    glPushAttrib(0x800);
    glViewport(0,0,(undefined4)buffer_w,(undefined4)buffer_h);
    glMatrixMode(0x1701);
    glPushMatrix();
    glLoadIdentity();
    auVar10._4_4_ = buffer_w._4_4_;
    auVar10._0_4_ = (undefined4)buffer_w;
    auVar10._8_4_ = buffer_w._4_4_;
    auVar10._12_4_ = 0x45300000;
    auVar11._4_4_ = buffer_h._4_4_;
    auVar11._0_4_ = (undefined4)buffer_h;
    auVar11._8_4_ = buffer_h._4_4_;
    auVar11._12_4_ = 0x45300000;
    glOrtho(0,(auVar10._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(undefined4)buffer_w) - 4503599627370496.0),
            (auVar11._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(undefined4)buffer_h) - 4503599627370496.0),0,0,
            0x3ff0000000000000);
    glMatrixMode(0x1700);
    glPushMatrix();
    glLoadIdentity();
    glTranslatef(0,0,0xbf800000);
    glDisable(0xb71);
    glDisable(0xb50);
    local_b0 = local_a0;
    local_a8 = 0;
    local_a0[0] = 0;
    local_d0 = local_c0;
    local_c8 = (char *)0x0;
    local_c0[0] = 0;
    if (errorFatal == '\x01') {
      std::__cxx11::string::_M_replace((ulong)&local_b0,0,(char *)0x0,0x2200ee);
      std::__cxx11::string::_M_replace((ulong)&local_d0,0,local_c8,0x2200fa);
    }
    else {
      std::__cxx11::string::_M_replace((ulong)&local_b0,0,(char *)0x0,0x2200f4);
      std::__cxx11::string::_M_replace((ulong)&local_d0,0,local_c8,0x220112);
    }
    bVar2 = HDPI;
    glBegin(7);
    glColor4f();
    glVertex2f(0,0);
    glVertex2f(0,(float)CONCAT44(buffer_h._4_4_,(undefined4)buffer_h));
    glVertex2f((float)CONCAT44(buffer_w._4_4_,(undefined4)buffer_w),
               (float)CONCAT44(buffer_h._4_4_,(undefined4)buffer_h));
    glVertex2f((float)CONCAT44(buffer_w._4_4_,(undefined4)buffer_w));
    uVar9 = CONCAT44(buffer_h._4_4_,(undefined4)buffer_h);
    uVar1 = CONCAT44(buffer_w._4_4_,(undefined4)buffer_w);
    glColor4f();
    uVar9 = uVar9 / 6;
    glVertex2f();
    glVertex2f();
    glVertex2f();
    glVertex2f();
    glEnd();
    pOVar7 = osd_text;
    uVar6 = buffer_h._4_4_;
    uVar5 = (undefined4)buffer_h;
    uVar4 = buffer_w._4_4_;
    uVar3 = (undefined4)buffer_w;
    auVar12._4_4_ = buffer_w._4_4_;
    auVar12._0_4_ = (undefined4)buffer_w;
    auVar15._4_4_ = buffer_h._4_4_;
    auVar15._0_4_ = (undefined4)buffer_h;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_b0,local_b0 + local_a8);
    dVar18 = (double)(long)((ulong)bVar2 * 0x20 + uVar1 / 6 + 0x20);
    dVar18 = dVar18 + dVar18;
    lVar8 = uVar9 + 0x30;
    if (bVar2 != 0) {
      lVar8 = uVar9 + 0x60;
    }
    auVar15._8_4_ = uVar6;
    auVar15._12_4_ = 0x45300000;
    auVar12._8_4_ = uVar4;
    auVar12._12_4_ = 0x45300000;
    color.b = 1.0;
    color.a = 1.0;
    color.r = 1.0;
    color.g = 1.0;
    line_id = OSDText::add_line(pOVar7,(float)(dVar18 / ((auVar12._8_8_ - 1.9342813113834067e+25) +
                                                        ((double)CONCAT44(0x43300000,uVar3) -
                                                        4503599627370496.0)) + -1.0),
                                (float)(1.0 - ((double)lVar8 + (double)lVar8) /
                                              ((auVar15._8_8_ - 1.9342813113834067e+25) +
                                              ((double)CONCAT44(0x43300000,uVar5) -
                                              4503599627370496.0))),&local_90,0x20,color);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    pOVar7 = osd_text;
    uVar6 = buffer_h._4_4_;
    uVar5 = (undefined4)buffer_h;
    uVar4 = buffer_w._4_4_;
    uVar3 = (undefined4)buffer_w;
    auVar13._4_4_ = buffer_w._4_4_;
    auVar13._0_4_ = (undefined4)buffer_w;
    auVar16._4_4_ = buffer_h._4_4_;
    auVar16._0_4_ = (undefined4)buffer_h;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,errorMessage_abi_cxx11_,DAT_0024adc8 + errorMessage_abi_cxx11_);
    lVar8 = uVar9 + 0x60;
    if (bVar2 != 0) {
      lVar8 = uVar9 + 0xc0;
    }
    auVar16._8_4_ = uVar6;
    auVar16._12_4_ = 0x45300000;
    auVar13._8_4_ = uVar4;
    auVar13._12_4_ = 0x45300000;
    color_00.b = 1.0;
    color_00.a = 1.0;
    color_00.r = 1.0;
    color_00.g = 1.0;
    line_id_00 = OSDText::add_line(pOVar7,(float)(dVar18 / ((auVar13._8_8_ - 1.9342813113834067e+25)
                                                           + ((double)CONCAT44(0x43300000,uVar3) -
                                                             4503599627370496.0)) + -1.0),
                                   (float)(1.0 - ((double)lVar8 + (double)lVar8) /
                                                 ((auVar16._8_8_ - 1.9342813113834067e+25) +
                                                 ((double)CONCAT44(0x43300000,uVar5) -
                                                 4503599627370496.0))),&local_50,0x20,color_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    pOVar7 = osd_text;
    uVar6 = buffer_h._4_4_;
    uVar5 = (undefined4)buffer_h;
    uVar4 = buffer_w._4_4_;
    uVar3 = (undefined4)buffer_w;
    auVar14._4_4_ = buffer_w._4_4_;
    auVar14._0_4_ = (undefined4)buffer_w;
    auVar17._4_4_ = buffer_h._4_4_;
    auVar17._0_4_ = (undefined4)buffer_h;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_d0,local_c8 + (long)local_d0);
    lVar8 = uVar9 + 0x120;
    if (bVar2 == 0) {
      lVar8 = uVar9 + 0x90;
    }
    auVar17._8_4_ = uVar6;
    auVar17._12_4_ = 0x45300000;
    auVar14._8_4_ = uVar4;
    auVar14._12_4_ = 0x45300000;
    color_01.b = 1.0;
    color_01.a = 1.0;
    color_01.r = 1.0;
    color_01.g = 1.0;
    line_id_01 = OSDText::add_line(pOVar7,(float)(dVar18 / ((auVar14._8_8_ - 1.9342813113834067e+25)
                                                           + ((double)CONCAT44(0x43300000,uVar3) -
                                                             4503599627370496.0)) + -1.0),
                                   (float)(1.0 - ((double)lVar8 + (double)lVar8) /
                                                 ((auVar17._8_8_ - 1.9342813113834067e+25) +
                                                 ((double)CONCAT44(0x43300000,uVar5) -
                                                 4503599627370496.0))),&local_70,0x10,color_01);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    OSDText::render(osd_text);
    OSDText::del_line(osd_text,line_id);
    OSDText::del_line(osd_text,line_id_00);
    OSDText::del_line(osd_text,line_id_01);
    glMatrixMode(0x1701);
    glPopMatrix();
    glMatrixMode(0x1700);
    glPopMatrix();
    glPopAttrib();
    glEnable(0xb71);
    glEnable(0xb50);
    if (local_d0 != local_c0) {
      operator_delete(local_d0);
    }
    if (local_b0 != local_a0) {
      operator_delete(local_b0);
    }
  }
  return;
}

Assistant:

void Viewer::drawError() {

    if( !showingError) {
        return;
    }
   
    printf("Showing Error! *******************\n");

    // GL prep
    // Note: This was copied in, I think it's a bit overkill
    glPushAttrib(GL_VIEWPORT_BIT);
    glViewport(0, 0, buffer_w, buffer_h);
    glMatrixMode(GL_PROJECTION);
    glPushMatrix();
    glLoadIdentity();
    glOrtho(0, buffer_w, buffer_h, 0, 0, 1);
    glMatrixMode(GL_MODELVIEW);
    glPushMatrix();
    glLoadIdentity();
    glTranslatef(0, 0, -1);
    glDisable(GL_DEPTH_TEST);
    glDisable(GL_LIGHTING);
    
    // Style based on error type
    std::string errorTitle;
    std::string clickPrompt;
    Color errorColor;
    if(errorFatal) {
        errorColor = Color(.85, .3, .3);
        errorTitle = "FATAL ERROR";
        clickPrompt = "Click anywhere to exit.";
    } else { 
        errorColor = Color(1.0, .65, .2);
        errorTitle = "ERROR";
        clickPrompt = "Click anywhere to dismiss.";
    }

    // == Draw the error overlay
    int textSize = 16;
    int textHeight = HDPI ? 2*textSize : textSize;
    glBegin(GL_QUADS);

    // Gray out the background
    glColor4f(.5, .5, .5, .8);
    glVertex2f(0,0);
    glVertex2f(0,buffer_h);
    glVertex2f(buffer_w, buffer_h);
    glVertex2f(buffer_w, 0);

    // Draw a scary red box
    size_t boxHeight = 11*textHeight;
    boxHeight = std::min(boxHeight, 2*buffer_h/3);
    size_t boxWidth = 2*buffer_w/3;
    size_t boxX0 = buffer_w/6;
    size_t boxY0 = buffer_h/6;
    glColor4f(errorColor.r, errorColor.g, errorColor.b, 0.8);
    glVertex2f(boxX0 + boxWidth, boxY0);
    glVertex2f(boxX0 + boxWidth, boxY0 + boxHeight);
    glVertex2f(boxX0, boxY0 + boxHeight);
    glVertex2f(boxX0, boxY0);

    glEnd();
    
    // == Draw the text
    // Note that the coordinates in each command are transformed to the [-1,1] coordinates used in OSDText.

    int id1 = osd_text->add_line(2.0*(boxX0 + 2*textHeight)/buffer_w - 1.0,
                                -2.0*(boxY0 + 3*textHeight)/buffer_h + 1.0, 
                                 errorTitle, 2*textSize, Color(1,1,1));
    int id2 = osd_text->add_line(2.0*(boxX0 + 2*textHeight)/buffer_w - 1.0,
                                -2.0*(boxY0 + 6*textHeight)/buffer_h + 1.0, 
                                 errorMessage, 2*textSize, Color(1,1,1));
    int id3 = osd_text->add_line(2.0*(boxX0 + 2*textHeight)/buffer_w - 1.0,
                                -2.0*(boxY0 + 9*textHeight)/buffer_h + 1.0, 
                                 clickPrompt, textSize, Color(1,1,1));
    
    osd_text->render();
    osd_text->del_line(id1);
    osd_text->del_line(id2);
    osd_text->del_line(id3);

    // GL cleanup
    glMatrixMode(GL_PROJECTION);
    glPopMatrix();
    glMatrixMode(GL_MODELVIEW);
    glPopMatrix();
    glPopAttrib();
    glEnable(GL_DEPTH_TEST);
    glEnable(GL_LIGHTING);
}